

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Reader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP3Reader::~BP3Reader(BP3Reader *this)

{
  byte bVar1;
  undefined8 in_RDX;
  BP3Deserializer *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__BP3Reader_0112d470;
  if (((in_RDI->m_DeferredVariablesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count & 1) != 0)
  {
    bVar1 = *(byte *)((long)&(in_RDI->m_DeferredVariablesMap)._M_t._M_impl.super__Rb_tree_header.
                             _M_node_count + 1);
    (**(code **)(*(long *)in_RDI + 0x428))
              (in_RDI,bVar1 & 1,in_RDX,CONCAT71(0x112d4,bVar1) & 0xffffffffffffff01);
  }
  *(undefined1 *)&(in_RDI->m_DeferredVariablesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count
       = 0;
  transportman::TransportMan::~TransportMan((TransportMan *)0x9e8aec);
  transportman::TransportMan::~TransportMan((TransportMan *)0x9e8afd);
  adios2::format::BP3Deserializer::~BP3Deserializer(in_RDI);
  Engine::~Engine((Engine *)in_RDI);
  return;
}

Assistant:

BP3Reader::~BP3Reader()
{
    if (m_IsOpen)
    {
        DestructorClose(m_FailVerbose);
    }
    m_IsOpen = false;
}